

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram.c
# Opt level: O0

CURLcode Curl_auth_decode_cram_md5_message(char *chlg64,char **outptr,size_t *outlen)

{
  size_t sVar1;
  size_t chlg64len;
  CURLcode result;
  size_t *outlen_local;
  char **outptr_local;
  char *chlg64_local;
  
  chlg64len._4_4_ = CURLE_OK;
  sVar1 = strlen(chlg64);
  *outptr = (char *)0x0;
  *outlen = 0;
  if ((sVar1 != 0) && (*chlg64 != '=')) {
    chlg64len._4_4_ = Curl_base64_decode(chlg64,(uchar **)outptr,outlen);
  }
  return chlg64len._4_4_;
}

Assistant:

CURLcode Curl_auth_decode_cram_md5_message(const char *chlg64, char **outptr,
                                           size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t chlg64len = strlen(chlg64);

  *outptr = NULL;
  *outlen = 0;

  /* Decode the challenge if necessary */
  if(chlg64len && *chlg64 != '=')
    result = Curl_base64_decode(chlg64, (unsigned char **) outptr, outlen);

  return result;
}